

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_MffcRef_rec(Abc_Obj_t *pObj,Vec_Int_t *vMffc)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  dVar6 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  iVar4 = (int)((float)dVar6 * 1000.0);
  iVar2 = (pObj->vFanins).nSize;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
      iVar1 = (pObj_00->vFanouts).nSize;
      (pObj_00->vFanouts).nSize = iVar1 + 1;
      if (((iVar1 == 0) && (uVar3 = *(uint *)&pObj_00->field_0x14 & 0xf, uVar3 != 2)) &&
         (uVar3 != 5)) {
        iVar2 = Sfm_MffcRef_rec(pObj_00,vMffc);
        iVar4 = iVar4 + iVar2;
        iVar2 = (pObj->vFanins).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  if (vMffc != (Vec_Int_t *)0x0) {
    Vec_IntPush(vMffc,pObj->Id);
  }
  return iVar4;
}

Assistant:

int Sfm_MffcRef_rec( Abc_Obj_t * pObj, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( pFanin->vFanouts.nSize++ == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcRef_rec( pFanin, vMffc );
    }
    if ( vMffc )
        Vec_IntPush( vMffc, Abc_ObjId(pObj) );
    return Area;
}